

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

FT_Error T1_Set_MM_Design(T1_Face face,FT_UInt num_coords,FT_Long *coords)

{
  PS_Blend pPVar1;
  long *plVar2;
  FT_Long *pFVar3;
  long lVar4;
  FT_Error FVar5;
  FT_Long in_RAX;
  PS_DesignMapRec *pPVar6;
  ulong uVar7;
  FT_Long FVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  char cVar14;
  ulong uVar15;
  FT_Fixed local_c8;
  FT_Fixed final_blends [16];
  
  pPVar1 = face->blend;
  if (pPVar1 == (PS_Blend)0x0) {
    FVar5 = 6;
  }
  else {
    uVar9 = pPVar1->num_axis;
    if (uVar9 < num_coords) {
      num_coords = uVar9;
    }
    if (uVar9 != 0) {
      uVar15 = 0;
      do {
        pPVar6 = pPVar1->design_map + uVar15;
        plVar2 = pPVar6->design_points;
        if (uVar15 < num_coords) {
          FVar8 = coords[uVar15];
        }
        else {
          FVar8 = (plVar2[(ulong)pPVar6->num_points - 1] - *plVar2) / 2;
        }
        pFVar3 = pPVar1->design_map[uVar15].blend_points;
        uVar7 = (ulong)pPVar6->num_points;
        if (uVar7 == 0) {
          uVar11 = 0xffffffff;
          uVar9 = 0xffffffff;
        }
        else {
          uVar10 = 0xffffffff;
          uVar13 = 0;
          uVar12 = 0xffffffff;
          do {
            lVar4 = plVar2[uVar13];
            if (FVar8 == lVar4) {
              in_RAX = pFVar3[uVar13];
              cVar14 = '\b';
            }
            else {
              cVar14 = (FVar8 < lVar4) * '\x05';
              if (FVar8 < lVar4) {
                uVar10 = uVar13 & 0xffffffff;
              }
              else {
                uVar12 = uVar13 & 0xffffffff;
              }
            }
            uVar9 = (uint)uVar10;
            uVar11 = (uint)uVar12;
            if (cVar14 != '\0') {
              if (cVar14 != '\x05') goto LAB_002345fd;
              break;
            }
            uVar13 = uVar13 + 1;
          } while (uVar7 != uVar13);
        }
        if ((int)uVar11 < 0) {
          in_RAX = *pFVar3;
        }
        else if ((int)uVar9 < 0) {
          in_RAX = pFVar3[uVar7 - 1];
        }
        else {
          in_RAX = FT_MulDiv(FVar8 - plVar2[uVar11],pFVar3[uVar9] - pFVar3[uVar11],
                             plVar2[uVar9] - plVar2[uVar11]);
        }
LAB_002345fd:
        final_blends[uVar15 - 1] = in_RAX;
        uVar15 = uVar15 + 1;
        uVar9 = pPVar1->num_axis;
      } while (uVar15 < uVar9);
    }
    FVar5 = t1_set_mm_blend(face,uVar9,&local_c8);
    if (FVar5 == 0) {
      (face->root).face_flags =
           (ulong)(num_coords != 0) << 0xf | (face->root).face_flags & 0xffffffffffff7fffU;
      FVar5 = 0;
    }
  }
  return FVar5;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Set_MM_Design( T1_Face   face,
                    FT_UInt   num_coords,
                    FT_Long*  coords )
  {
    FT_Error  error;
    PS_Blend  blend = face->blend;
    FT_UInt   n, p;
    FT_Fixed  final_blends[T1_MAX_MM_DESIGNS];


    if ( !blend )
      return FT_THROW( Invalid_Argument );

    if ( num_coords > blend->num_axis )
      num_coords = blend->num_axis;

    /* compute the blend coordinates through the blend design map */

    for ( n = 0; n < blend->num_axis; n++ )
    {
      FT_Long       design;
      FT_Fixed      the_blend;
      PS_DesignMap  map     = blend->design_map + n;
      FT_Long*      designs = map->design_points;
      FT_Fixed*     blends  = map->blend_points;
      FT_Int        before  = -1, after = -1;


      /* use a default value if we don't have a coordinate */
      if ( n < num_coords )
        design = coords[n];
      else
        design = ( designs[map->num_points - 1] - designs[0] ) / 2;

      for ( p = 0; p < (FT_UInt)map->num_points; p++ )
      {
        FT_Long  p_design = designs[p];


        /* exact match? */
        if ( design == p_design )
        {
          the_blend = blends[p];
          goto Found;
        }

        if ( design < p_design )
        {
          after = (FT_Int)p;
          break;
        }

        before = (FT_Int)p;
      }

      /* now interpolate if necessary */
      if ( before < 0 )
        the_blend = blends[0];

      else if ( after < 0 )
        the_blend = blends[map->num_points - 1];

      else
        the_blend = FT_MulDiv( design         - designs[before],
                               blends [after] - blends [before],
                               designs[after] - designs[before] );

    Found:
      final_blends[n] = the_blend;
    }

    error = t1_set_mm_blend( face, blend->num_axis, final_blends );
    if ( error )
      return error;

    if ( num_coords )
      face->root.face_flags |= FT_FACE_FLAG_VARIATION;
    else
      face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;

    return FT_Err_Ok;
  }